

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O0

void * device_clone_option(char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  void *result;
  void *value_local;
  char *name_local;
  
  if ((name == (char *)0x0) || (value == (void *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"device_clone_option",0x281,1,
                "Failed to clone device option (either name (%p) or value (%p) is NULL)",name,value)
      ;
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    iVar1 = strcmp(DEVICE_OPTION_SAVED_AUTH_OPTIONS,name);
    if ((iVar1 == 0) || (iVar1 = strcmp(DEVICE_OPTION_SAVED_MESSENGER_OPTIONS,name), iVar1 == 0)) {
      l = (LOGGER_LOG)OptionHandler_Clone((OPTIONHANDLER_HANDLE)value);
      if (((OPTIONHANDLER_HANDLE)l == (OPTIONHANDLER_HANDLE)0x0) &&
         (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                  ,"device_clone_option",0x28b,1,
                  "Failed to clone device option (OptionHandler_Clone failed for option %s)",name);
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                  ,"device_clone_option",0x290,1,
                  "Failed to clone device option (option with name \'%s\' is not suppported)",name);
      }
      l = (LOGGER_LOG)0x0;
    }
  }
  return l;
}

Assistant:

static void* device_clone_option(const char* name, const void* value)
{
    void* result;

    if (name == NULL || value == NULL)
    {
        LogError("Failed to clone device option (either name (%p) or value (%p) is NULL)", name, value);
        result = NULL;
    }
    else
    {
        if (strcmp(DEVICE_OPTION_SAVED_AUTH_OPTIONS, name) == 0 ||
            strcmp(DEVICE_OPTION_SAVED_MESSENGER_OPTIONS, name) == 0)
        {
            if ((result = (void*)OptionHandler_Clone((OPTIONHANDLER_HANDLE)value)) == NULL)
            {
                LogError("Failed to clone device option (OptionHandler_Clone failed for option %s)", name);
            }
        }
        else
        {
            LogError("Failed to clone device option (option with name '%s' is not suppported)", name);
            result = NULL;
        }
    }

    return result;
}